

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O1

Test * anon_unknown.dwarf_e24fa::DiskInterfaceTestStatMissingFile::Create(void)

{
  g_current_test = (Test *)operator_new(0x58);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test[1]._vptr_Test = (_func_int **)(g_current_test + 2);
  g_current_test[1].failed_ = false;
  *(undefined3 *)&g_current_test[1].field_0x9 = 0;
  g_current_test[1].assertion_failures_ = 0;
  *(undefined1 *)&g_current_test[2]._vptr_Test = 0;
  g_current_test[3]._vptr_Test = (_func_int **)(g_current_test + 4);
  g_current_test[3].failed_ = false;
  *(undefined3 *)&g_current_test[3].field_0x9 = 0;
  g_current_test[3].assertion_failures_ = 0;
  *(undefined1 *)&g_current_test[4]._vptr_Test = 0;
  g_current_test[5]._vptr_Test = (_func_int **)&PTR__FileReader_001d8c88;
  g_current_test->_vptr_Test = (_func_int **)&PTR__DiskInterfaceTest_001d4be8;
  return g_current_test;
}

Assistant:

TEST_F(DiskInterfaceTest, StatMissingFile) {
  string err;
  EXPECT_EQ(0, disk_.Stat("nosuchfile", &err));
  EXPECT_EQ("", err);

  // On Windows, the errno for a file in a nonexistent directory
  // is different.
  EXPECT_EQ(0, disk_.Stat("nosuchdir/nosuchfile", &err));
  EXPECT_EQ("", err);

  // On POSIX systems, the errno is different if a component of the
  // path prefix is not a directory.
  ASSERT_TRUE(Touch("notadir"));
  EXPECT_EQ(0, disk_.Stat("notadir/nosuchfile", &err));
  EXPECT_EQ("", err);
}